

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query_relation.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true> __thiscall
duckdb::QueryRelation::GetTableRef(QueryRelation *this)

{
  long *in_RSI;
  undefined1 local_40 [8];
  element_type *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  GetSelectStatement((QueryRelation *)local_40);
  (**(code **)(*in_RSI + 0x28))(&local_30);
  make_uniq<duckdb::SubqueryRef,duckdb::unique_ptr<duckdb::SelectStatement,std::default_delete<duckdb::SelectStatement>,true>,std::__cxx11::string>
            ((duckdb *)&local_38,
             (unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
              *)local_40,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  if ((_Head_base<0UL,_duckdb::SelectStatement_*,_false>)local_40 !=
      (_Head_base<0UL,_duckdb::SelectStatement_*,_false>)0x0) {
    (*((SQLStatement *)local_40)->_vptr_SQLStatement[1])();
  }
  (this->super_Relation)._vptr_Relation = (_func_int **)local_38;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)this;
}

Assistant:

unique_ptr<TableRef> QueryRelation::GetTableRef() {
	auto subquery_ref = make_uniq<SubqueryRef>(GetSelectStatement(), GetAlias());
	return std::move(subquery_ref);
}